

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O2

int OPENSSL_lh_insert(_LHASH *lh,void **old_data,void *data,lhash_hash_func_helper call_hash_func,
                     lhash_cmp_func_helper call_cmp_func)

{
  undefined8 in_RAX;
  LHASH_ITEM **ppLVar1;
  LHASH_ITEM *pLVar2;
  uint32_t hash;
  
  hash = (uint32_t)((ulong)in_RAX >> 0x20);
  *old_data = (void *)0x0;
  ppLVar1 = get_next_ptr_and_hash(lh,&hash,data,call_hash_func,call_cmp_func);
  if (*ppLVar1 == (LHASH_ITEM *)0x0) {
    pLVar2 = (LHASH_ITEM *)OPENSSL_malloc(0x18);
    if (pLVar2 == (LHASH_ITEM *)0x0) {
      return 0;
    }
    pLVar2->data = data;
    pLVar2->hash = hash;
    pLVar2->next = (lhash_item_st *)0x0;
    *ppLVar1 = pLVar2;
    lh->num_items = lh->num_items + 1;
    lh_maybe_resize(lh);
  }
  else {
    *old_data = (*ppLVar1)->data;
    (*ppLVar1)->data = data;
  }
  return 1;
}

Assistant:

int OPENSSL_lh_insert(_LHASH *lh, void **old_data, void *data,
                      lhash_hash_func_helper call_hash_func,
                      lhash_cmp_func_helper call_cmp_func) {
  uint32_t hash;
  LHASH_ITEM **next_ptr, *item;

  *old_data = NULL;
  next_ptr =
      get_next_ptr_and_hash(lh, &hash, data, call_hash_func, call_cmp_func);


  if (*next_ptr != NULL) {
    // An element equal to |data| already exists in the hash table. It will be
    // replaced.
    *old_data = (*next_ptr)->data;
    (*next_ptr)->data = data;
    return 1;
  }

  // An element equal to |data| doesn't exist in the hash table yet.
  item = reinterpret_cast<LHASH_ITEM *>(OPENSSL_malloc(sizeof(LHASH_ITEM)));
  if (item == NULL) {
    return 0;
  }

  item->data = data;
  item->hash = hash;
  item->next = NULL;
  *next_ptr = item;
  lh->num_items++;
  lh_maybe_resize(lh);

  return 1;
}